

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractLoggingDevice.cpp
# Opt level: O1

void __thiscall
SLogLib::AbstractLoggingDevice::SetBufferedMessagesCount(AbstractLoggingDevice *this,size_t x)

{
  int iVar1;
  undefined8 uVar2;
  recursive_mutex *__mutex;
  
  __mutex = &this->mPriv->mBufferedMessagesMutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->mPriv->mBufferedMessages,x);
    this->mPriv->mBufferedMessagesCount = x;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void AbstractLoggingDevice::SetBufferedMessagesCount(size_t x)
{
	std::lock_guard<std::recursive_mutex> _lock(mPriv->mBufferedMessagesMutex);
	mPriv->mBufferedMessages.reserve(x);
	mPriv->mBufferedMessagesCount = x;
}